

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void read_payload(cio_websocket *websocket,cio_buffered_stream *buffered_stream,
                 cio_read_buffer *buffer)

{
  _Bool _Var1;
  cio_error local_24;
  cio_error err;
  cio_read_buffer *buffer_local;
  cio_buffered_stream *buffered_stream_local;
  cio_websocket *websocket_local;
  
  if ((websocket->ws_private).remaining_read_frame_length == 0) {
    handle_frame(websocket,(uint8_t *)0x0,0);
  }
  else {
    _Var1 = is_control_frame((uint)(*(ushort *)&(websocket->ws_private).ws_flags >> 1 & 0xf));
    if (_Var1) {
      local_24 = cio_buffered_stream_read_at_least
                           (buffered_stream,buffer,
                            (websocket->ws_private).remaining_read_frame_length,get_payload,
                            websocket);
    }
    else {
      local_24 = cio_buffered_stream_read_at_most
                           (buffered_stream,buffer,
                            (websocket->ws_private).remaining_read_frame_length,get_payload,
                            websocket);
    }
    if (local_24 != CIO_SUCCESS) {
      handle_error(websocket,local_24,CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR,
                   "error while start reading websocket payload");
    }
  }
  return;
}

Assistant:

static void read_payload(struct cio_websocket *websocket, struct cio_buffered_stream *buffered_stream, struct cio_read_buffer *buffer)
{
	if (cio_likely(websocket->ws_private.remaining_read_frame_length > 0)) {
		if (cio_unlikely(websocket->ws_private.remaining_read_frame_length > SIZE_MAX)) {
			handle_error(websocket, CIO_MESSAGE_TOO_LONG, CIO_WEBSOCKET_CLOSE_TOO_LARGE, "websocket frame to large to process!");
			return;
		}

		enum cio_error err = CIO_SUCCESS;
		if (cio_unlikely(is_control_frame(websocket->ws_private.ws_flags.opcode))) {
			err = cio_buffered_stream_read_at_least(buffered_stream, buffer, websocket->ws_private.remaining_read_frame_length, get_payload, websocket);
		} else {
			err = cio_buffered_stream_read_at_most(buffered_stream, buffer, websocket->ws_private.remaining_read_frame_length, get_payload, websocket);
		}

		if (cio_unlikely(err != CIO_SUCCESS)) {
			handle_error(websocket, err, CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR, "error while start reading websocket payload");
		}
	} else {
		handle_frame(websocket, NULL, 0);
	}
}